

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::DeleteEntries(BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *this,EntryType *entries,int size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t byteSize;
  Type this_00;
  
  if (entries == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x462,"(entries)","entries");
    if (!bVar2) goto LAB_004765b6;
    *puVar3 = 0;
  }
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x463,"(size != 0)","size != 0");
    if (!bVar2) {
LAB_004765b6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = this->alloc;
    byteSize = 0;
  }
  else {
    this_00 = this->alloc;
    if (size == 1) {
      (entries->
      super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>.
      super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
      .
      super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
      .value = (Value *)this_00->bvFreeList;
      this_00->bvFreeList = (BVSparseNode *)entries;
      return;
    }
    byteSize = (long)size * 0x18;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,entries,
             byteSize);
  return;
}

Assistant:

void DeleteEntries(__in_ecount(size) EntryType *const entries, const int size)
        {
            Assert(entries);
            Assert(size != 0);

            AllocatorFree(alloc, EntryAllocatorFuncType::GetFreeFunc(), entries, size * sizeof(EntryType));
        }